

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_impl.h
# Opt level: O0

void secp256k1_fe_get_bounds(secp256k1_fe *r,int m)

{
  int in_ESI;
  secp256k1_fe *in_RDI;
  undefined4 in_stack_fffffffffffffff0;
  
  if (in_ESI < 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/field_impl.h"
            ,0x19a,"test condition failed: m >= 0");
    abort();
  }
  if (0x20 < in_ESI) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/field_impl.h"
            ,0x19b,"test condition failed: m <= 32");
    abort();
  }
  secp256k1_fe_impl_get_bounds(in_RDI,in_ESI);
  in_RDI->magnitude = in_ESI;
  in_RDI->normalized = (uint)(in_ESI == 0);
  secp256k1_fe_verify((secp256k1_fe *)CONCAT44(in_ESI,in_stack_fffffffffffffff0));
  return;
}

Assistant:

SECP256K1_INLINE static void secp256k1_fe_get_bounds(secp256k1_fe* r, int m) {
    VERIFY_CHECK(m >= 0);
    VERIFY_CHECK(m <= 32);
    secp256k1_fe_impl_get_bounds(r, m);
    r->magnitude = m;
    r->normalized = (m == 0);
    secp256k1_fe_verify(r);
}